

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void err_msgv(lua_State *L,ErrMsg em,...)

{
  char in_AL;
  ulong uVar1;
  long in_RDI;
  lua_State *in_XMM0_Qa;
  cTValue *in_XMM2_Qa;
  cTValue *in_XMM2_Qb;
  char *in_XMM3_Qa;
  lua_State *in_XMM3_Qb;
  __va_list_tag *in_stack_00000038;
  char *in_stack_00000040;
  lua_State *in_stack_00000048;
  TValue *base;
  va_list argp;
  char *msg;
  lua_State *in_stack_ffffffffffffff38;
  cTValue *in_stack_ffffffffffffff58;
  cTValue *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  lua_State *in_stack_ffffffffffffff70;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff38 = in_XMM0_Qa;
    in_stack_ffffffffffffff58 = in_XMM2_Qa;
    in_stack_ffffffffffffff60 = in_XMM2_Qb;
    in_stack_ffffffffffffff68 = in_XMM3_Qa;
    in_stack_ffffffffffffff70 = in_XMM3_Qb;
  }
  uVar1 = (ulong)*(uint *)((ulong)*(uint *)(in_RDI + 8) + 400);
  if (uVar1 != 0) {
    *(ulong *)(in_RDI + 0x10) = uVar1;
  }
  if (*(char *)((ulong)*(uint *)(*(long *)(in_RDI + 0x10) + -8) + 6) == '\0') {
    *(long *)(in_RDI + 0x18) =
         *(long *)(in_RDI + 0x10) +
         (long)(int)(uint)*(byte *)((ulong)*(uint *)((ulong)*(uint *)(*(long *)(in_RDI + 0x10) + -8)
                                                    + 0x10) - 0x39) * 8;
  }
  lj_strfmt_pushvf(in_stack_00000048,in_stack_00000040,in_stack_00000038);
  lj_debug_addloc(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                  in_stack_ffffffffffffff58);
  lj_err_run(in_stack_ffffffffffffff38);
}

Assistant:

static void err_msgv(lua_State *L, ErrMsg em, ...)
{
  const char *msg;
  va_list argp;
  va_start(argp, em);
  if (LJ_HASJIT) {
    TValue *base = tvref(G(L)->jit_base);
    if (base) L->base = base;
  }
  if (curr_funcisL(L)) L->top = curr_topL(L);
  msg = lj_strfmt_pushvf(L, err2msg(em), argp);
  va_end(argp);
  lj_debug_addloc(L, msg, L->base-1, NULL);
  lj_err_run(L);
}